

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Pack.h
# Opt level: O3

axl_va_list * __thiscall
axl::sl::PackPtrSize::operator()
          (axl_va_list *__return_storage_ptr__,PackPtrSize *this,void *p,size_t *size,
          axl_va_list *va)

{
  uint uVar1;
  undefined8 *puVar2;
  size_t __n;
  undefined8 uVar3;
  size_t *psVar4;
  void *src;
  ulong uVar5;
  
  uVar1 = *(uint *)va;
  uVar5 = (ulong)uVar1;
  if (uVar5 < 0x29) {
    *(int *)va = (int)(uVar5 + 8);
    src = *(void **)(*(long *)&va->field_0x10 + uVar5);
    if (uVar1 < 0x21) {
      psVar4 = (size_t *)(uVar5 + 8 + *(long *)&va->field_0x10);
      *(uint *)va = uVar1 + 0x10;
      goto LAB_001427e1;
    }
  }
  else {
    puVar2 = *(undefined8 **)&va->field_0x8;
    *(undefined8 **)&va->field_0x8 = puVar2 + 1;
    src = (void *)*puVar2;
  }
  psVar4 = *(size_t **)&va->field_0x8;
  *(size_t **)&va->field_0x8 = psVar4 + 1;
LAB_001427e1:
  __n = *psVar4;
  *size = __n;
  if (p != (void *)0x0) {
    if (src == (void *)0x0) {
      memset(p,0,__n);
    }
    else {
      __wrap_memcpy(p,src,__n);
    }
  }
  __return_storage_ptr__->m_isInitialized = false;
  uVar3 = *(undefined8 *)&va->field_0x8;
  *(undefined8 *)__return_storage_ptr__ = *(undefined8 *)va;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = uVar3;
  *(undefined8 *)&__return_storage_ptr__->field_0x10 = *(undefined8 *)&va->field_0x10;
  __return_storage_ptr__->m_isInitialized = true;
  return __return_storage_ptr__;
}

Assistant:

axl_va_list
	operator () (
		void* p,
		size_t* size,
		axl_va_list va
	) {
		void* obj = va.arg<void*> ();
		size_t objSize = va.arg<size_t> ();

		*size = objSize;

		if (p) {
			if (obj)
				memcpy(p, obj, objSize);
			else
				memset(p, 0, objSize);
		}

		return va;
	}